

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

myarima_object
search_arima(double *x,int N,int d,int D,int p_max,int q_max,int P_max,int Q_max,int Order_max,
            int stationary,int s,char *ic,int approximation,double *xreg,int r,double offset,
            int allowdrift,int allowmean,int verbose,int method)

{
  sarimax_object psVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  myarima_object pmVar5;
  undefined4 in_register_0000000c;
  int constant;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 uStack_d8;
  int bestseasonal [4];
  double local_b0;
  undefined8 local_a8;
  int bestorder [3];
  undefined8 local_88;
  int aiStack_80 [4];
  undefined8 local_70;
  int order [3];
  
  register0x00000008 = CONCAT44(in_register_0000000c,D);
  order[0] = 0;
  local_70 = 0;
  local_88 = 0;
  aiStack_80[0] = 0;
  aiStack_80[1] = 0;
  bestorder[0] = 0;
  local_a8 = 0;
  uStack_d8 = 0;
  bestseasonal[0] = 0;
  bestseasonal[1] = 0;
  local_b0 = 1.79769313486232e+308;
  unique0x1000059b = offset;
  iVar3 = 0;
  do {
    if (-1 < q_max) {
      iVar2 = 0;
      do {
        if (-1 < P_max) {
          uVar4 = 0;
          do {
            if (-1 < Q_max) {
              bestorder[1] = uVar4 | order[2];
              iVar7 = 0;
              do {
                if ((int)(iVar3 + iVar2 + uVar4 + iVar7) <= Order_max) {
                  bVar8 = bestorder[1] == 0;
                  uVar6 = 0;
                  do {
                    local_70 = CONCAT44(d,iVar3);
                    if (bVar8 && iVar7 == 0 || s == 0) {
                      local_88 = 0;
                      aiStack_80[0] = 0;
                      aiStack_80[1] = 0;
                    }
                    else {
                      local_88 = CONCAT44((int)stack0xffffffffffffffa0,uVar4);
                      aiStack_80[1] = s;
                      aiStack_80[0] = iVar7;
                    }
                    constant = (int)uVar6;
                    order[0] = iVar2;
                    pmVar5 = myarima(x,N,(int *)&local_70,(int *)&local_88,constant,ic,
                                     (int)in_stack_fffffffffffffef8,approximation,
                                     stack0xffffffffffffff68,xreg,r,(int *)0x0);
                    if (verbose == 1) {
                      psVar1 = pmVar5->sarimax;
                      printf("p: %d d: %d q: %d P: %d D: %d Q: %d Drift/Mean: %d ic: %g \n",
                             SUB84(pmVar5->ic,0),(ulong)(uint)psVar1->p,(ulong)(uint)d,
                             (ulong)(uint)psVar1->q,(ulong)(uint)psVar1->P,stack0xffffffffffffffa0,
                             (ulong)(uint)psVar1->Q,uVar6);
                    }
                    if (pmVar5->ic < local_b0) {
                      bestorder[0] = order[0];
                      local_a8 = local_70;
                      uStack_d8 = local_88;
                      bestseasonal[0] = aiStack_80[0];
                      bestseasonal[1] = aiStack_80[1];
                      bestseasonal._8_8_ = (undefined8)constant;
                      local_b0 = pmVar5->ic;
                    }
                    free(pmVar5->sarimax);
                    free(pmVar5);
                    uVar6 = (ulong)(constant + 1);
                  } while ((D + d == 0 && allowmean != 0 || D + d == 1 && allowdrift != 0) &&
                           constant == 0);
                }
                bVar8 = iVar7 != Q_max;
                iVar7 = iVar7 + 1;
              } while (bVar8);
            }
            bVar8 = uVar4 != P_max;
            uVar4 = uVar4 + 1;
          } while (bVar8);
        }
        bVar8 = iVar2 != q_max;
        iVar2 = iVar2 + 1;
      } while (bVar8);
    }
    bVar8 = iVar3 != p_max;
    iVar3 = iVar3 + 1;
  } while (bVar8);
  pmVar5 = myarima(x,N,(int *)&local_a8,(int *)&uStack_d8,(int)(double)bestseasonal._8_8_,ic,
                   (int)in_stack_fffffffffffffef8,approximation,stack0xffffffffffffff68,xreg,r,
                   (int *)0x0);
  if (((approximation != 0) && (pmVar5->ic == 1.79769313486232e+308)) && (!NAN(pmVar5->ic))) {
    free(pmVar5->sarimax);
    free(pmVar5);
    pmVar5 = search_arima(x,N,d,(int)stack0xffffffffffffffa0,p_max,q_max,P_max,Q_max,Order_max,
                          stationary,s,ic,0,xreg,r,stack0xffffffffffffff68,allowdrift,allowmean,
                          verbose,method);
  }
  return pmVar5;
}

Assistant:

myarima_object search_arima(double *x, int N,int d, int D, int p_max, int q_max, int P_max, int Q_max, int Order_max, int stationary,int s, const char *ic,
	int approximation, double *xreg, int r, double offset,int allowdrift, int allowmean,int verbose, int method) {

	int idrift, imean, maxK, i, j, I, J,K;
	double best_ic,bestK,iapprox;
	myarima_object bestfit;
	myarima_object fit;
	int order[3] = {0,0,0};
	int seasonal[4] = {0,0,0,0};
	int bestorder[3] = {0,0,0};
	int bestseasonal[4] = {0,0,0,0};
	int trace = 0;

	
	idrift = allowdrift && (d + D == 1);

	imean = allowmean && (d + D == 0);

	maxK = (idrift || imean);

	//serial implementation

	//printf("d %d D %d p_max %d q_max %d P_max %d Q_max %d maxK %d \n",d,D,p_max,q_max,P_max,Q_max,maxK);

	best_ic = DBL_MAX;

	for(i = 0; i <= p_max; ++i) {
		for(j = 0;j <= q_max;++j) {
			for(I = 0; I <= P_max;++I) {
				for(J = 0; J <= Q_max; ++J) {
					if (i+j+I+J <= Order_max) {
						for(K = 0; K <= maxK; ++K) {
							order[0] = i;
							order[1] = d;
							order[2] = j;
							
							// bug fix: still need to set PDQ or else carries over
							// prior PDQ parameters in seasonal which may be non 0 but then attempt
							// to optimize model with > 0 PDQ which can throw seg faults
							// for example in emle.fcssx when mutating phi which assumes s is > 0 if P+Q is > 0
							if (
								s == 0 ||
								(I == 0 && J == 0 && D == 0)
							) {
								seasonal[0] = seasonal[1] = seasonal[2] = seasonal[3] = 0;
							} else {
								seasonal[0] = I;
								seasonal[1] = D;
								seasonal[2] = J;
								seasonal[3] = s;
							}

							fit = myarima(x,N,order,seasonal, K, ic, trace, approximation, offset,xreg, r, NULL);
							if (verbose == 1) {
								printf("p: %d d: %d q: %d P: %d D: %d Q: %d Drift/Mean: %d ic: %g \n",fit->sarimax->p,d,fit->sarimax->q,fit->sarimax->P,D,fit->sarimax->Q,K,fit->ic);
							}
							
							//myarima_summary(fit);

							if (best_ic > fit->ic) {
								best_ic = fit->ic;
								memcpy(bestorder,order,sizeof(int)*3);
								memcpy(bestseasonal,seasonal,sizeof(int)*4);
								bestK = K;
							}

							myarima_free(fit);

						}
					}
				}
			}
		}
	}

	//printf("best_ic %g \n",best_ic);

	bestfit = myarima(x,N,bestorder,bestseasonal, bestK, ic, trace, approximation, offset,xreg, r, NULL);

	if (approximation) {
		if (bestfit->ic == DBL_MAX) {
			iapprox = 0;
			myarima_free(bestfit);

			bestfit = search_arima(x,N,d,D,p_max,q_max,P_max,Q_max,Order_max,stationary,s,ic,iapprox,xreg,r,offset,allowdrift,allowmean,verbose,method);

		}
	}


	return bestfit;
}